

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_warp_plane_sse4.c
# Opt level: O0

void highbd_prepare_warp_horizontal_filter
               (uint16_t *ref,__m128i *tmp,int stride,int32_t ix4,int32_t iy4,int32_t sx4,int alpha,
               int beta,int p_height,int height,int i,int offset_bits_horiz,int reduce_bits_horiz)

{
  undefined8 unaff_RBX;
  undefined8 in_RDI;
  __m128i *unaff_R14;
  uint16_t *unaff_R15;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  __m128i *in_stack_00000058;
  uint16_t *in_stack_00000060;
  
  if ((in_stack_00000008 == 0) && (in_stack_00000010 == 0)) {
    highbd_warp_horizontal_filter_alpha0_beta0
              (in_stack_00000060,in_stack_00000058,ref._4_4_,(int32_t)ref,tmp._4_4_,(int32_t)tmp,
               alpha,beta,p_height,height,i,offset_bits_horiz,reduce_bits_horiz);
  }
  else if ((in_stack_00000008 == 0) && (in_stack_00000010 != 0)) {
    highbd_warp_horizontal_filter_alpha0
              (in_stack_00000060,in_stack_00000058,ref._4_4_,(int32_t)ref,tmp._4_4_,(int32_t)tmp,
               alpha,beta,p_height,height,i,offset_bits_horiz,reduce_bits_horiz);
  }
  else if ((in_stack_00000008 == 0) || (in_stack_00000010 != 0)) {
    highbd_warp_horizontal_filter
              (unaff_R15,unaff_R14,(int)((ulong)unaff_RBX >> 0x20),(int32_t)unaff_RBX,
               (int32_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI,in_stack_00000010,in_stack_00000018,
               in_stack_00000020,in_stack_00000028,in_stack_00000030,sx4,ix4);
  }
  else {
    highbd_warp_horizontal_filter_beta0
              (in_stack_00000060,in_stack_00000058,ref._4_4_,(int32_t)ref,tmp._4_4_,(int32_t)tmp,
               alpha,beta,p_height,height,i,offset_bits_horiz,reduce_bits_horiz);
  }
  return;
}

Assistant:

static inline void highbd_prepare_warp_horizontal_filter(
    const uint16_t *ref, __m128i *tmp, int stride, int32_t ix4, int32_t iy4,
    int32_t sx4, int alpha, int beta, int p_height, int height, int i,
    const int offset_bits_horiz, const int reduce_bits_horiz) {
  if (alpha == 0 && beta == 0)
    highbd_warp_horizontal_filter_alpha0_beta0(
        ref, tmp, stride, ix4, iy4, sx4, alpha, beta, p_height, height, i,
        offset_bits_horiz, reduce_bits_horiz);

  else if (alpha == 0 && beta != 0)
    highbd_warp_horizontal_filter_alpha0(ref, tmp, stride, ix4, iy4, sx4, alpha,
                                         beta, p_height, height, i,
                                         offset_bits_horiz, reduce_bits_horiz);

  else if (alpha != 0 && beta == 0)
    highbd_warp_horizontal_filter_beta0(ref, tmp, stride, ix4, iy4, sx4, alpha,
                                        beta, p_height, height, i,
                                        offset_bits_horiz, reduce_bits_horiz);
  else
    highbd_warp_horizontal_filter(ref, tmp, stride, ix4, iy4, sx4, alpha, beta,
                                  p_height, height, i, offset_bits_horiz,
                                  reduce_bits_horiz);
}